

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::
int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned___int128>::
on_num(int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned___int128>
       *this)

{
  unsigned___int128 *puVar1;
  char *pcVar2;
  char cVar3;
  basic_format_specs<char> *pbVar4;
  undefined1 auVar5 [16];
  int iVar6;
  char cVar7;
  uint uVar8;
  ulong uVar9;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar10;
  int iVar11;
  _Alloc_hider _Var12;
  int iVar13;
  char *pcVar14;
  long lVar15;
  int iVar16;
  size_type sVar17;
  ulong uVar18;
  char *pcVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  string groups;
  char digits [40];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  string local_298;
  char local_278 [48];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  grouping_impl<char>(&local_298,(locale_ref)(this->locale).locale_);
  if (local_298._M_string_length == 0) {
    on_dec(this);
    goto LAB_0020b71e;
  }
  cVar7 = thousands_sep_impl<char>((locale_ref)(this->locale).locale_);
  if (cVar7 == '\0') {
    on_dec(this);
    goto LAB_0020b71e;
  }
  puVar1 = &this->abs_value;
  uVar22 = (ulong)*puVar1;
  uVar9 = *(ulong *)((long)&this->abs_value + 8);
  auVar5 = (undefined1  [16])*puVar1;
  auVar24 = (undefined1  [16])*puVar1;
  uVar21 = 1;
  if ((uVar22 < 10) <= uVar9) {
    uVar21 = 4;
    auVar23 = auVar24;
    do {
      uVar20 = auVar23._8_8_;
      uVar18 = auVar23._0_8_;
      iVar11 = (int)uVar21;
      if (uVar20 == 0 && (ulong)(99 < uVar18) <= -uVar20) {
        uVar21 = (ulong)(iVar11 - 2);
        goto LAB_0020b3fa;
      }
      if (uVar20 == 0 && (ulong)(999 < uVar18) <= -uVar20) {
        uVar21 = (ulong)(iVar11 - 1);
        goto LAB_0020b3fa;
      }
      if (uVar20 < (uVar18 < 10000)) goto LAB_0020b3fa;
      auVar23 = __udivti3(uVar18,uVar20,10000,0);
      uVar21 = (ulong)(iVar11 + 4);
    } while (uVar20 != 0 || -uVar20 < (ulong)(99999 < uVar18));
    uVar21 = (ulong)(iVar11 + 1);
  }
LAB_0020b3fa:
  iVar11 = (int)uVar21;
  _Var12._M_p = local_298._M_dataplus._M_p;
  uVar18 = uVar21;
  uVar20 = uVar21;
  if (local_298._M_string_length == 0) {
LAB_0020b443:
    iVar16 = (int)uVar20;
    uVar8 = (uint)uVar18;
    if (_Var12._M_p == local_298._M_dataplus._M_p + local_298._M_string_length) goto LAB_0020b44e;
  }
  else {
    iVar16 = iVar11 + (int)local_298._M_string_length;
    sVar17 = local_298._M_string_length;
    do {
      cVar3 = *_Var12._M_p;
      uVar8 = (int)uVar18 - (int)cVar3;
      if ((uVar8 == 0 || (int)uVar18 < (int)cVar3) || ((byte)(cVar3 + 0x81U) < 0x82))
      goto LAB_0020b443;
      uVar20 = (ulong)((int)uVar20 + 1);
      _Var12._M_p = _Var12._M_p + 1;
      uVar18 = (ulong)uVar8;
      sVar17 = sVar17 - 1;
    } while (sVar17 != 0);
LAB_0020b44e:
    iVar16 = (int)(uVar8 - 1) / (int)(local_298._M_dataplus._M_p + local_298._M_string_length)[-1] +
             iVar16;
  }
  iVar13 = 1;
  if ((uVar22 < 10) <= uVar9) {
    iVar6 = 4;
    auVar23 = auVar24;
    do {
      iVar13 = iVar6;
      uVar20 = auVar23._8_8_;
      uVar18 = auVar23._0_8_;
      if (uVar20 == 0 && (ulong)(99 < uVar18) <= -uVar20) {
        iVar13 = iVar13 + -2;
        goto LAB_0020b4f1;
      }
      if (uVar20 == 0 && (ulong)(999 < uVar18) <= -uVar20) {
        iVar13 = iVar13 + -1;
        goto LAB_0020b4f1;
      }
      if (uVar20 < (uVar18 < 10000)) goto LAB_0020b4f1;
      auVar23 = __udivti3(uVar18,uVar20,10000,0);
      iVar6 = iVar13 + 4;
    } while (uVar20 != 0 || -uVar20 < (ulong)(99999 < uVar18));
    iVar13 = iVar13 + 1;
  }
LAB_0020b4f1:
  if (iVar11 < iVar13) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/include/fmt/format.h"
                ,0x41b,"invalid digit count");
  }
  pcVar14 = local_278 + iVar11;
  pcVar19 = pcVar14;
  if ((uVar22 < 100) <= uVar9) {
    do {
      lVar15 = auVar24._8_8_;
      uVar22 = auVar24._0_8_;
      pcVar14 = pcVar19 + -2;
      auVar24 = __udivti3(uVar22,lVar15,100,0);
      *(undefined2 *)(pcVar19 + -2) =
           *(undefined2 *)(basic_data<void>::digits + (uVar22 + auVar24._0_8_ * -100) * 2);
      pcVar19 = pcVar14;
      auVar5 = auVar24;
    } while (lVar15 != 0 || (ulong)-lVar15 < (ulong)(9999 < uVar22));
  }
  if (auVar5._8_8_ == 0 && (ulong)(9 < auVar5._0_8_) <= (ulong)-auVar5._8_8_) {
    pcVar14[-1] = auVar5[0] | 0x30;
  }
  else {
    *(undefined2 *)(pcVar14 + -2) = *(undefined2 *)(basic_data<void>::digits + auVar5._0_8_ * 2);
  }
  local_248.super_buffer<char>.size_ = 0;
  local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0025a2a8;
  local_248.super_buffer<char>.ptr_ = local_248.store_;
  local_248.super_buffer<char>.capacity_ = 500;
  uVar8 = iVar16 + this->prefix_size;
  if (-1 < (int)uVar8) {
    uVar22 = (ulong)uVar8;
    if (500 < uVar8) {
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,uVar22);
    }
    pcVar14 = local_248.super_buffer<char>.ptr_;
    local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
    if (uVar22 <= local_248.super_buffer<char>.capacity_) {
      local_248.super_buffer<char>.size_ = uVar22;
    }
    pcVar19 = local_248.super_buffer<char>.ptr_ + (uVar22 - 1);
    if (1 < iVar11) {
      uVar21 = uVar21 + 1;
      iVar11 = 0;
      _Var12._M_p = local_298._M_dataplus._M_p;
      do {
        pcVar2 = pcVar19 + -1;
        *pcVar19 = local_278[uVar21 - 2];
        cVar3 = *_Var12._M_p;
        if ('\0' < cVar3) {
          iVar11 = iVar11 + 1;
          if ((cVar3 != '\x7f') && (iVar11 % (int)cVar3 == 0)) {
            if (_Var12._M_p + 1 != local_298._M_dataplus._M_p + local_298._M_string_length) {
              iVar11 = 0;
              _Var12._M_p = _Var12._M_p + 1;
            }
            pcVar19[-1] = cVar7;
            pcVar2 = pcVar19 + -2;
          }
        }
        pcVar19 = pcVar2;
        uVar21 = uVar21 - 1;
      } while (2 < uVar21);
    }
    *pcVar19 = local_278[0];
    if (this->prefix_size != 0) {
      pcVar19[-1] = 0x2d;
    }
    pbVar4 = this->specs;
    uVar9 = (ulong)pbVar4->width;
    if (-1 < (long)uVar9) {
      uVar21 = 0;
      if (uVar22 <= uVar9) {
        uVar21 = uVar9 - uVar22;
      }
      uVar9 = uVar21 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                  (ulong)((byte)pbVar4->field_0x9 & 0xf)) & 0x3f);
      bVar10 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                         ((this->out).container,uVar9,&pbVar4->fill);
      bVar10 = std::__copy_move<false,false,std::random_access_iterator_tag>::
               __copy_m<char*,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                         (pcVar14,pcVar14 + uVar22,bVar10);
      bVar10 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                         (bVar10,uVar21 - uVar9,&pbVar4->fill);
      (this->out).container = bVar10.container;
      if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
        operator_delete(local_248.super_buffer<char>.ptr_);
      }
LAB_0020b71e:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p);
      }
      return;
    }
  }
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/include/fmt/core.h"
              ,0x146,"negative value");
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }